

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

void OpenMD::SquareMatrix3<double>::diagonalize
               (SquareMatrix3<double> *a,Vector3<double> *w,SquareMatrix3<double> *v)

{
  double dVar1;
  double *pdVar2;
  RectMatrix<double,_3U,_3U> *in_RDX;
  Vector<double,_3U> *in_RSI;
  double dVar3;
  Vector3<double> v_j;
  Vector3<double> v_k;
  Vector3<double> v_maxI;
  double maxVal;
  double tmp;
  int maxI;
  int k;
  int j;
  int i;
  SquareMatrix3<double> *in_stack_fffffffffffffce8;
  SquareMatrix<double,_3> *in_stack_fffffffffffffcf0;
  SquareMatrix3<double> *this;
  SquareMatrix3<double> *in_stack_fffffffffffffcf8;
  uint uVar4;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffd00;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffd08;
  SquareMatrix3<double> *in_stack_fffffffffffffd18;
  Vector3<double> *in_stack_fffffffffffffd50;
  Vector3<double> *v1;
  SquareMatrix3<double> local_210 [3];
  SquareMatrix<double,_3> *in_stack_fffffffffffffec8;
  Vector<double,_3U> *in_stack_fffffffffffffed0;
  SquareMatrix<double,_3> *in_stack_fffffffffffffed8;
  double local_38;
  uint local_28;
  uint local_20;
  uint local_1c;
  
  Vector3<double>::Vector3((Vector3<double> *)0x2d02bc);
  Vector3<double>::Vector3((Vector3<double> *)0x2d02c9);
  Vector3<double>::Vector3((Vector3<double> *)0x2d02d6);
  SquareMatrix<double,_3>::jacobi
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pdVar2 = Vector<double,_3U>::operator[](in_RSI,0);
  dVar3 = *pdVar2;
  pdVar2 = Vector<double,_3U>::operator[](in_RSI,1);
  if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) {
    pdVar2 = Vector<double,_3U>::operator[](in_RSI,0);
    dVar3 = *pdVar2;
    pdVar2 = Vector<double,_3U>::operator[](in_RSI,2);
    if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) {
      SquareMatrix<double,_3>::identity();
      operator=(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2d03b2);
      return;
    }
  }
  transpose(in_stack_fffffffffffffd18);
  operator=((SquareMatrix3<double> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  ~SquareMatrix3((SquareMatrix3<double> *)0x2d041e);
  local_1c = 0;
  while( true ) {
    if (2 < (int)local_1c) {
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,0,0);
      local_38 = ABS(*pdVar2);
      local_28 = 0;
      for (local_1c = 1; (int)local_1c < 3; local_1c = local_1c + 1) {
        dVar3 = local_38;
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,0);
        if (dVar3 < ABS(*pdVar2)) {
          local_28 = local_1c;
          local_38 = ABS(*pdVar2);
        }
      }
      if (local_28 != 0) {
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,local_28);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,0);
        dVar1 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,local_28);
        *pdVar2 = dVar1;
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,0);
        *pdVar2 = dVar3;
        RectMatrix<double,_3U,_3U>::swapRow
                  (in_stack_fffffffffffffd00,(uint)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                   (uint)in_stack_fffffffffffffcf8);
      }
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,1,1);
      dVar3 = *pdVar2;
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,1);
      if (ABS(dVar3) < ABS(*pdVar2)) {
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,2);
        dVar3 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,1);
        dVar1 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,2);
        *pdVar2 = dVar1;
        pdVar2 = Vector<double,_3U>::operator()(in_RSI,1);
        *pdVar2 = dVar3;
        RectMatrix<double,_3U,_3U>::swapRow
                  (in_stack_fffffffffffffd00,(uint)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                   (uint)in_stack_fffffffffffffcf8);
      }
      for (local_1c = 0; (int)local_1c < 2; local_1c = local_1c + 1) {
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,local_1c);
        if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,0);
          dVar3 = *pdVar2;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,0);
          *pdVar2 = -dVar3;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,1);
          in_stack_fffffffffffffd18 = (SquareMatrix3<double> *)((ulong)*pdVar2 ^ 0x8000000000000000)
          ;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,1);
          *pdVar2 = (double)in_stack_fffffffffffffd18;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,2);
          dVar3 = *pdVar2;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,2);
          *pdVar2 = -dVar3;
        }
      }
      dVar3 = determinant((SquareMatrix3<double> *)in_RDX);
      if (dVar3 < 0.0) {
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,0);
        dVar3 = -*pdVar2;
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,0);
        *pdVar2 = dVar3;
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,1);
        dVar3 = -*pdVar2;
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,1);
        *pdVar2 = dVar3;
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,2);
        dVar3 = -*pdVar2;
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,2,2);
        *pdVar2 = dVar3;
      }
      this = local_210;
      transpose(in_stack_fffffffffffffd18);
      operator=(this,in_stack_fffffffffffffce8);
      ~SquareMatrix3((SquareMatrix3<double> *)0x2d0f8c);
      return;
    }
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,(int)(local_1c + 1) % 3);
    dVar3 = *pdVar2;
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,(int)(local_1c + 2) % 3);
    if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) break;
    local_1c = local_1c + 1;
  }
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,0);
  local_38 = ABS(*pdVar2);
  local_28 = 0;
  for (local_20 = 1; (int)local_20 < 3; local_20 = local_20 + 1) {
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_1c,local_20);
    if (local_38 < ABS(*pdVar2)) {
      local_28 = local_20;
      local_38 = ABS(*pdVar2);
    }
  }
  if (local_28 != local_1c) {
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,local_28);
    dVar3 = *pdVar2;
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,local_1c);
    dVar1 = *pdVar2;
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,local_28);
    *pdVar2 = dVar1;
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,local_1c);
    *pdVar2 = dVar3;
    RectMatrix<double,_3U,_3U>::swapRow
              (in_stack_fffffffffffffd00,(uint)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
               (uint)in_stack_fffffffffffffcf8);
  }
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,local_28);
  if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,0);
    dVar3 = *pdVar2;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,0);
    *pdVar2 = -dVar3;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,1);
    dVar3 = *pdVar2;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,1);
    *pdVar2 = -dVar3;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,2);
    dVar3 = *pdVar2;
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,2);
    *pdVar2 = -dVar3;
  }
  uVar4 = local_28 + 1 + ((int)(local_28 + 1) / 3) * -3;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,uVar4,0);
  *pdVar2 = 0.0;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,uVar4,1);
  *pdVar2 = 0.0;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,uVar4,2);
  *pdVar2 = 0.0;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,uVar4,uVar4);
  *pdVar2 = 1.0;
  v1 = (Vector3<double> *)&stack0xfffffffffffffec8;
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffd08,(uint)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffcf8,
             (Vector<double,_3U> *)in_stack_fffffffffffffcf0);
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffd08,(uint)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffcf8,
             (Vector<double,_3U> *)in_stack_fffffffffffffcf0);
  uVar4 = (uint)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  cross<double>(v1,in_stack_fffffffffffffd50);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffcf0,
             (Vector3<double> *)in_stack_fffffffffffffce8);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffcf0);
  cross<double>(v1,in_stack_fffffffffffffd50);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffcf0,
             (Vector3<double> *)in_stack_fffffffffffffce8);
  RectMatrix<double,_3U,_3U>::setRow
            (in_stack_fffffffffffffd00,uVar4,(Vector<double,_3U> *)in_stack_fffffffffffffcf0);
  RectMatrix<double,_3U,_3U>::setRow
            (in_stack_fffffffffffffd00,uVar4,(Vector<double,_3U> *)in_stack_fffffffffffffcf0);
  transpose(in_stack_fffffffffffffd18);
  operator=((SquareMatrix3<double> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  ~SquareMatrix3((SquareMatrix3<double> *)0x2d0a1e);
  return;
}

Assistant:

void SquareMatrix3<Real>::diagonalize(SquareMatrix3<Real>& a,
                                        Vector3<Real>& w,
                                        SquareMatrix3<Real>& v) {
    int i, j, k, maxI;
    Real tmp, maxVal;
    Vector3<Real> v_maxI, v_k, v_j;

    // diagonalize using Jacobi
    SquareMatrix3<Real>::jacobi(a, w, v);
    // if all the eigenvalues are the same, return identity matrix
    if (w[0] == w[1] && w[0] == w[2]) {
      v = SquareMatrix3<Real>::identity();
      return;
    }

    // transpose temporarily, it makes it easier to sort the eigenvectors
    v = v.transpose();

    // if two eigenvalues are the same, re-orthogonalize to optimally line
    // up the eigenvectors with the x, y, and z axes
    for (i = 0; i < 3; i++) {
      if (w((i + 1) % 3) == w((i + 2) % 3)) {  // two eigenvalues are the same
        // find maximum element of the independant eigenvector
        maxVal = fabs(v(i, 0));
        maxI   = 0;
        for (j = 1; j < 3; j++) {
          if (maxVal < (tmp = fabs(v(i, j)))) {
            maxVal = tmp;
            maxI   = j;
          }
        }

        // swap the eigenvector into its proper position
        if (maxI != i) {
          tmp     = w(maxI);
          w(maxI) = w(i);
          w(i)    = tmp;

          v.swapRow(i, maxI);
        }
        // maximum element of eigenvector should be positive
        if (v(maxI, maxI) < 0) {
          v(maxI, 0) = -v(maxI, 0);
          v(maxI, 1) = -v(maxI, 1);
          v(maxI, 2) = -v(maxI, 2);
        }

        // re-orthogonalize the other two eigenvectors
        j = (maxI + 1) % 3;
        k = (maxI + 2) % 3;

        v(j, 0) = 0.0;
        v(j, 1) = 0.0;
        v(j, 2) = 0.0;
        v(j, j) = 1.0;

        /** @todo */
        v_maxI = v.getRow(maxI);
        v_j    = v.getRow(j);
        v_k    = cross(v_maxI, v_j);
        v_k.normalize();
        v_j = cross(v_k, v_maxI);
        v.setRow(j, v_j);
        v.setRow(k, v_k);

        // transpose vectors back to columns
        v = v.transpose();
        return;
      }
    }

    // the three eigenvalues are different, just sort the eigenvectors
    // to align them with the x, y, and z axes

    // find the vector with the largest x element, make that vector
    // the first vector
    maxVal = fabs(v(0, 0));
    maxI   = 0;
    for (i = 1; i < 3; i++) {
      if (maxVal < (tmp = fabs(v(i, 0)))) {
        maxVal = tmp;
        maxI   = i;
      }
    }

    // swap eigenvalue and eigenvector
    if (maxI != 0) {
      tmp     = w(maxI);
      w(maxI) = w(0);
      w(0)    = tmp;
      v.swapRow(maxI, 0);
    }
    // do the same for the y element
    if (fabs(v(1, 1)) < fabs(v(2, 1))) {
      tmp  = w(2);
      w(2) = w(1);
      w(1) = tmp;
      v.swapRow(2, 1);
    }

    // ensure that the sign of the eigenvectors is correct
    for (i = 0; i < 2; i++) {
      if (v(i, i) < 0) {
        v(i, 0) = -v(i, 0);
        v(i, 1) = -v(i, 1);
        v(i, 2) = -v(i, 2);
      }
    }

    // set sign of final eigenvector to ensure that determinant is positive
    if (v.determinant() < 0) {
      v(2, 0) = -v(2, 0);
      v(2, 1) = -v(2, 1);
      v(2, 2) = -v(2, 2);
    }

    // transpose the eigenvectors back again
    v = v.transpose();
    return;
  }